

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *options_00;
  leveldb_comparator_t *db_00;
  uchar uVar1;
  int iVar2;
  leveldb_iterator_t *iter_00;
  size_t keylen;
  size_t vallen;
  leveldb_snapshot_t *snap_00;
  leveldb_filterpolicy_t *local_1d0;
  leveldb_filterpolicy_t *policy;
  leveldb_snapshot_t *snap;
  char *prop;
  size_t limit_len [2];
  char *limit [2];
  size_t start_len [2];
  char *start [2];
  uint64_t sizes [2];
  char valbuf [100];
  char local_f8 [8];
  char keybuf [100];
  uint local_8c;
  int n;
  int i;
  leveldb_iterator_t *iter;
  leveldb_writebatch_t *plStack_78;
  int pos;
  leveldb_writebatch_t *wb2;
  leveldb_writebatch_t *wb;
  char *pcStack_60;
  int run;
  char *err;
  char *dbname;
  leveldb_writeoptions_t *woptions;
  leveldb_readoptions_t *roptions;
  leveldb_options_t *options;
  leveldb_env_t *env;
  leveldb_cache_t *cache;
  leveldb_comparator_t *cmp;
  leveldb_t *db;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pcStack_60 = (char *)0x0;
  wb._4_4_ = 0xffffffff;
  db = (leveldb_t *)argv;
  argv_local._0_4_ = argc;
  iVar2 = leveldb_major_version();
  if (iVar2 < 1) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x9f,phase,"leveldb_major_version() >= 1");
    abort();
  }
  iVar2 = leveldb_minor_version();
  if (iVar2 < 1) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xa0,phase,"leveldb_minor_version() >= 1");
    abort();
  }
  StartPhase("create_objects");
  cache = (leveldb_cache_t *)leveldb_comparator_create((void *)0x0,CmpDestroy,CmpCompare,CmpName);
  options = (leveldb_options_t *)leveldb_create_default_env();
  env = (leveldb_env_t *)leveldb_cache_create_lru(100000);
  err = leveldb_env_get_test_directory((leveldb_env_t *)options);
  if (err == (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xa7,phase,"dbname != NULL");
    abort();
  }
  roptions = (leveldb_readoptions_t *)leveldb_options_create();
  leveldb_options_set_comparator((leveldb_options_t *)roptions,(leveldb_comparator_t *)cache);
  leveldb_options_set_error_if_exists((leveldb_options_t *)roptions,'\x01');
  leveldb_options_set_cache((leveldb_options_t *)roptions,(leveldb_cache_t *)env);
  leveldb_options_set_env((leveldb_options_t *)roptions,(leveldb_env_t *)options);
  leveldb_options_set_info_log((leveldb_options_t *)roptions,(leveldb_logger_t *)0x0);
  leveldb_options_set_write_buffer_size((leveldb_options_t *)roptions,100000);
  leveldb_options_set_paranoid_checks((leveldb_options_t *)roptions,'\x01');
  leveldb_options_set_max_open_files((leveldb_options_t *)roptions,10);
  leveldb_options_set_block_size((leveldb_options_t *)roptions,0x400);
  leveldb_options_set_block_restart_interval((leveldb_options_t *)roptions,8);
  leveldb_options_set_max_file_size((leveldb_options_t *)roptions,0x300000);
  leveldb_options_set_compression((leveldb_options_t *)roptions,0);
  woptions = (leveldb_writeoptions_t *)leveldb_readoptions_create();
  leveldb_readoptions_set_verify_checksums((leveldb_readoptions_t *)woptions,'\x01');
  leveldb_readoptions_set_fill_cache((leveldb_readoptions_t *)woptions,'\0');
  dbname = (char *)leveldb_writeoptions_create();
  leveldb_writeoptions_set_sync((leveldb_writeoptions_t *)dbname,'\x01');
  StartPhase("destroy");
  leveldb_destroy_db((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
  Free(&stack0xffffffffffffffa0);
  StartPhase("open_error");
  cmp = (leveldb_comparator_t *)
        leveldb_open((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
  if (pcStack_60 == (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xc4,phase,"err != NULL");
    abort();
  }
  Free(&stack0xffffffffffffffa0);
  StartPhase("leveldb_free");
  cmp = (leveldb_comparator_t *)
        leveldb_open((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
  if (pcStack_60 == (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xc9,phase,"err != NULL");
    abort();
  }
  leveldb_free(pcStack_60);
  pcStack_60 = (char *)0x0;
  StartPhase("open");
  leveldb_options_set_create_if_missing((leveldb_options_t *)roptions,'\x01');
  cmp = (leveldb_comparator_t *)
        leveldb_open((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xd0,phase,pcStack_60);
    abort();
  }
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo",(char *)0x0);
  StartPhase("put");
  leveldb_put((leveldb_t *)cmp,(leveldb_writeoptions_t *)dbname,"foo",3,"hello",5,
              &stack0xffffffffffffffa0);
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xd5,phase,pcStack_60);
    abort();
  }
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","hello");
  StartPhase("compactall");
  leveldb_compact_range((leveldb_t *)cmp,(char *)0x0,0,(char *)0x0,0);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","hello");
  StartPhase("compactrange");
  leveldb_compact_range((leveldb_t *)cmp,"a",1,"z",1);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","hello");
  StartPhase("writebatch");
  wb2 = leveldb_writebatch_create();
  leveldb_writebatch_put(wb2,"foo",3,"a",1);
  leveldb_writebatch_clear(wb2);
  leveldb_writebatch_put(wb2,"bar",3,"b",1);
  leveldb_writebatch_put(wb2,"box",3,"c",1);
  plStack_78 = leveldb_writebatch_create();
  leveldb_writebatch_delete(plStack_78,"bar",3);
  leveldb_writebatch_append(wb2,plStack_78);
  leveldb_writebatch_destroy(plStack_78);
  leveldb_write((leveldb_t *)cmp,(leveldb_writeoptions_t *)dbname,wb2,&stack0xffffffffffffffa0);
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xee,phase,pcStack_60);
    abort();
  }
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","hello");
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"bar",(char *)0x0);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"box","c");
  iter._4_4_ = 0;
  leveldb_writebatch_iterate(wb2,(void *)((long)&iter + 4),CheckPut,CheckDel);
  if (iter._4_4_ != 3) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xf5,phase,"pos == 3");
    abort();
  }
  leveldb_writebatch_destroy(wb2);
  StartPhase("iter");
  iter_00 = leveldb_create_iterator((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions);
  uVar1 = leveldb_iter_valid(iter_00);
  if (uVar1 != '\0') {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xfc,phase,"!leveldb_iter_valid(iter)");
    abort();
  }
  leveldb_iter_seek_to_first(iter_00);
  uVar1 = leveldb_iter_valid(iter_00);
  if (uVar1 == '\0') {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0xfe,phase,"leveldb_iter_valid(iter)");
    abort();
  }
  CheckIter(iter_00,"box","c");
  leveldb_iter_next(iter_00);
  CheckIter(iter_00,"foo","hello");
  leveldb_iter_prev(iter_00);
  CheckIter(iter_00,"box","c");
  leveldb_iter_prev(iter_00);
  uVar1 = leveldb_iter_valid(iter_00);
  if (uVar1 != '\0') {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x105,phase,"!leveldb_iter_valid(iter)");
    abort();
  }
  leveldb_iter_seek_to_last(iter_00);
  CheckIter(iter_00,"foo","hello");
  leveldb_iter_seek(iter_00,"b",1);
  CheckIter(iter_00,"box","c");
  leveldb_iter_get_error(iter_00,&stack0xffffffffffffffa0);
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x10b,phase,pcStack_60);
    abort();
  }
  leveldb_iter_destroy(iter_00);
  StartPhase("approximate_sizes");
  keybuf[0x60] = ' ';
  keybuf[0x61] = 'N';
  keybuf[0x62] = '\0';
  keybuf[99] = '\0';
  start_len[1] = (size_t)anon_var_dwarf_4f11;
  start[0] = "k00000000000000010000";
  limit[1] = (char *)0x1;
  start_len[0] = 0x15;
  limit_len[1] = (size_t)anon_var_dwarf_4fc6;
  limit[0] = "z";
  prop = (char *)0x15;
  limit_len[0] = 1;
  leveldb_writeoptions_set_sync((leveldb_writeoptions_t *)dbname,'\0');
  for (local_8c = 0; (int)local_8c < (int)keybuf._96_4_; local_8c = local_8c + 1) {
    snprintf(local_f8,100,"k%020d",(ulong)local_8c);
    snprintf((char *)(sizes + 1),100,"v%020d",(ulong)local_8c);
    db_00 = cmp;
    options_00 = dbname;
    keylen = strlen(local_f8);
    vallen = strlen((char *)(sizes + 1));
    leveldb_put((leveldb_t *)db_00,(leveldb_writeoptions_t *)options_00,local_f8,keylen,
                (char *)(sizes + 1),vallen,&stack0xffffffffffffffa0);
    if (pcStack_60 != (char *)0x0) {
      fprintf(_stderr,"%s:%d: %s: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c"
              ,0x120,phase,pcStack_60);
      abort();
    }
  }
  leveldb_approximate_sizes
            ((leveldb_t *)cmp,2,(char **)(start_len + 1),(size_t *)(limit + 1),
             (char **)(limit_len + 1),(size_t *)&prop,(uint64_t *)(start + 1));
  if (start[1] == (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x123,phase,"sizes[0] > 0");
    abort();
  }
  if (sizes[0] == 0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x124,phase,"sizes[1] > 0");
    abort();
  }
  StartPhase("property");
  snap = (leveldb_snapshot_t *)leveldb_property_value((leveldb_t *)cmp,"nosuchprop");
  if (snap != (leveldb_snapshot_t *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x12a,phase,"prop == NULL");
    abort();
  }
  snap = (leveldb_snapshot_t *)leveldb_property_value((leveldb_t *)cmp,"leveldb.stats");
  if (snap == (leveldb_snapshot_t *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            300,phase,"prop != NULL");
    abort();
  }
  Free((char **)&snap);
  StartPhase("snapshot");
  snap_00 = leveldb_create_snapshot((leveldb_t *)cmp);
  leveldb_delete((leveldb_t *)cmp,(leveldb_writeoptions_t *)dbname,"foo",3,&stack0xffffffffffffffa0)
  ;
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x135,phase,pcStack_60);
    abort();
  }
  leveldb_readoptions_set_snapshot((leveldb_readoptions_t *)woptions,snap_00);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","hello");
  leveldb_readoptions_set_snapshot((leveldb_readoptions_t *)woptions,(leveldb_snapshot_t *)0x0);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo",(char *)0x0);
  leveldb_release_snapshot((leveldb_t *)cmp,snap_00);
  StartPhase("repair");
  leveldb_close((leveldb_t *)cmp);
  leveldb_options_set_create_if_missing((leveldb_options_t *)roptions,'\0');
  leveldb_options_set_error_if_exists((leveldb_options_t *)roptions,'\0');
  leveldb_repair_db((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x143,phase,pcStack_60);
    abort();
  }
  cmp = (leveldb_comparator_t *)
        leveldb_open((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
  if (pcStack_60 != (char *)0x0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x145,phase,pcStack_60);
    abort();
  }
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo",(char *)0x0);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"bar",(char *)0x0);
  CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"box","c");
  leveldb_options_set_create_if_missing((leveldb_options_t *)roptions,'\x01');
  leveldb_options_set_error_if_exists((leveldb_options_t *)roptions,'\x01');
  StartPhase("filter");
  wb._4_4_ = 0;
  while( true ) {
    if (1 < wb._4_4_) {
      StartPhase("cleanup");
      leveldb_close((leveldb_t *)cmp);
      leveldb_options_destroy((leveldb_options_t *)roptions);
      leveldb_readoptions_destroy((leveldb_readoptions_t *)woptions);
      leveldb_writeoptions_destroy((leveldb_writeoptions_t *)dbname);
      leveldb_free(err);
      leveldb_cache_destroy((leveldb_cache_t *)env);
      leveldb_comparator_destroy((leveldb_comparator_t *)cache);
      leveldb_env_destroy((leveldb_env_t *)options);
      fprintf(_stderr,"PASS\n");
      return 0;
    }
    if (pcStack_60 != (char *)0x0) {
      fprintf(_stderr,"%s:%d: %s: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c"
              ,0x150,phase,pcStack_60);
      abort();
    }
    if (wb._4_4_ == 0) {
      local_1d0 = leveldb_filterpolicy_create
                            ((void *)0x0,FilterDestroy,FilterCreate,FilterKeyMatch,FilterName);
    }
    else {
      local_1d0 = leveldb_filterpolicy_create_bloom(10);
    }
    leveldb_close((leveldb_t *)cmp);
    leveldb_destroy_db((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
    leveldb_options_set_filter_policy((leveldb_options_t *)roptions,local_1d0);
    cmp = (leveldb_comparator_t *)
          leveldb_open((leveldb_options_t *)roptions,err,&stack0xffffffffffffffa0);
    if (pcStack_60 != (char *)0x0) {
      fprintf(_stderr,"%s:%d: %s: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c"
              ,0x15e,phase,pcStack_60);
      abort();
    }
    leveldb_put((leveldb_t *)cmp,(leveldb_writeoptions_t *)dbname,"foo",3,"foovalue",8,
                &stack0xffffffffffffffa0);
    if (pcStack_60 != (char *)0x0) {
      fprintf(_stderr,"%s:%d: %s: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c"
              ,0x160,phase,pcStack_60);
      abort();
    }
    leveldb_put((leveldb_t *)cmp,(leveldb_writeoptions_t *)dbname,"bar",3,"barvalue",8,
                &stack0xffffffffffffffa0);
    if (pcStack_60 != (char *)0x0) break;
    leveldb_compact_range((leveldb_t *)cmp,(char *)0x0,0,(char *)0x0,0);
    fake_filter_result = '\x01';
    CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","foovalue");
    CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"bar","barvalue");
    if (phase == (char *)0x0) {
      fake_filter_result = '\0';
      CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo",(char *)0x0);
      CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"bar",(char *)0x0);
      fake_filter_result = '\x01';
      CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"foo","foovalue");
      CheckGet((leveldb_t *)cmp,(leveldb_readoptions_t *)woptions,"bar","barvalue");
    }
    leveldb_options_set_filter_policy((leveldb_options_t *)roptions,(leveldb_filterpolicy_t *)0x0);
    leveldb_filterpolicy_destroy(local_1d0);
    wb._4_4_ = wb._4_4_ + 1;
  }
  fprintf(_stderr,"%s:%d: %s: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
          0x162,phase,pcStack_60);
  abort();
}

Assistant:

int main(int argc, char** argv) {
  leveldb_t* db;
  leveldb_comparator_t* cmp;
  leveldb_cache_t* cache;
  leveldb_env_t* env;
  leveldb_options_t* options;
  leveldb_readoptions_t* roptions;
  leveldb_writeoptions_t* woptions;
  char* dbname;
  char* err = NULL;
  int run = -1;

  CheckCondition(leveldb_major_version() >= 1);
  CheckCondition(leveldb_minor_version() >= 1);

  StartPhase("create_objects");
  cmp = leveldb_comparator_create(NULL, CmpDestroy, CmpCompare, CmpName);
  env = leveldb_create_default_env();
  cache = leveldb_cache_create_lru(100000);
  dbname = leveldb_env_get_test_directory(env);
  CheckCondition(dbname != NULL);

  options = leveldb_options_create();
  leveldb_options_set_comparator(options, cmp);
  leveldb_options_set_error_if_exists(options, 1);
  leveldb_options_set_cache(options, cache);
  leveldb_options_set_env(options, env);
  leveldb_options_set_info_log(options, NULL);
  leveldb_options_set_write_buffer_size(options, 100000);
  leveldb_options_set_paranoid_checks(options, 1);
  leveldb_options_set_max_open_files(options, 10);
  leveldb_options_set_block_size(options, 1024);
  leveldb_options_set_block_restart_interval(options, 8);
  leveldb_options_set_max_file_size(options, 3 << 20);
  leveldb_options_set_compression(options, leveldb_no_compression);

  roptions = leveldb_readoptions_create();
  leveldb_readoptions_set_verify_checksums(roptions, 1);
  leveldb_readoptions_set_fill_cache(roptions, 0);

  woptions = leveldb_writeoptions_create();
  leveldb_writeoptions_set_sync(woptions, 1);

  StartPhase("destroy");
  leveldb_destroy_db(options, dbname, &err);
  Free(&err);

  StartPhase("open_error");
  db = leveldb_open(options, dbname, &err);
  CheckCondition(err != NULL);
  Free(&err);

  StartPhase("leveldb_free");
  db = leveldb_open(options, dbname, &err);
  CheckCondition(err != NULL);
  leveldb_free(err);
  err = NULL;

  StartPhase("open");
  leveldb_options_set_create_if_missing(options, 1);
  db = leveldb_open(options, dbname, &err);
  CheckNoError(err);
  CheckGet(db, roptions, "foo", NULL);

  StartPhase("put");
  leveldb_put(db, woptions, "foo", 3, "hello", 5, &err);
  CheckNoError(err);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("compactall");
  leveldb_compact_range(db, NULL, 0, NULL, 0);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("compactrange");
  leveldb_compact_range(db, "a", 1, "z", 1);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("writebatch");
  {
    leveldb_writebatch_t* wb = leveldb_writebatch_create();
    leveldb_writebatch_put(wb, "foo", 3, "a", 1);
    leveldb_writebatch_clear(wb);
    leveldb_writebatch_put(wb, "bar", 3, "b", 1);
    leveldb_writebatch_put(wb, "box", 3, "c", 1);

    leveldb_writebatch_t* wb2 = leveldb_writebatch_create();
    leveldb_writebatch_delete(wb2, "bar", 3);
    leveldb_writebatch_append(wb, wb2);
    leveldb_writebatch_destroy(wb2);

    leveldb_write(db, woptions, wb, &err);
    CheckNoError(err);
    CheckGet(db, roptions, "foo", "hello");
    CheckGet(db, roptions, "bar", NULL);
    CheckGet(db, roptions, "box", "c");

    int pos = 0;
    leveldb_writebatch_iterate(wb, &pos, CheckPut, CheckDel);
    CheckCondition(pos == 3);
    leveldb_writebatch_destroy(wb);
  }

  StartPhase("iter");
  {
    leveldb_iterator_t* iter = leveldb_create_iterator(db, roptions);
    CheckCondition(!leveldb_iter_valid(iter));
    leveldb_iter_seek_to_first(iter);
    CheckCondition(leveldb_iter_valid(iter));
    CheckIter(iter, "box", "c");
    leveldb_iter_next(iter);
    CheckIter(iter, "foo", "hello");
    leveldb_iter_prev(iter);
    CheckIter(iter, "box", "c");
    leveldb_iter_prev(iter);
    CheckCondition(!leveldb_iter_valid(iter));
    leveldb_iter_seek_to_last(iter);
    CheckIter(iter, "foo", "hello");
    leveldb_iter_seek(iter, "b", 1);
    CheckIter(iter, "box", "c");
    leveldb_iter_get_error(iter, &err);
    CheckNoError(err);
    leveldb_iter_destroy(iter);
  }

  StartPhase("approximate_sizes");
  {
    int i;
    int n = 20000;
    char keybuf[100];
    char valbuf[100];
    uint64_t sizes[2];
    const char* start[2] = { "a", "k00000000000000010000" };
    size_t start_len[2] = { 1, 21 };
    const char* limit[2] = { "k00000000000000010000", "z" };
    size_t limit_len[2] = { 21, 1 };
    leveldb_writeoptions_set_sync(woptions, 0);
    for (i = 0; i < n; i++) {
      snprintf(keybuf, sizeof(keybuf), "k%020d", i);
      snprintf(valbuf, sizeof(valbuf), "v%020d", i);
      leveldb_put(db, woptions, keybuf, strlen(keybuf), valbuf, strlen(valbuf),
                  &err);
      CheckNoError(err);
    }
    leveldb_approximate_sizes(db, 2, start, start_len, limit, limit_len, sizes);
    CheckCondition(sizes[0] > 0);
    CheckCondition(sizes[1] > 0);
  }

  StartPhase("property");
  {
    char* prop = leveldb_property_value(db, "nosuchprop");
    CheckCondition(prop == NULL);
    prop = leveldb_property_value(db, "leveldb.stats");
    CheckCondition(prop != NULL);
    Free(&prop);
  }

  StartPhase("snapshot");
  {
    const leveldb_snapshot_t* snap;
    snap = leveldb_create_snapshot(db);
    leveldb_delete(db, woptions, "foo", 3, &err);
    CheckNoError(err);
    leveldb_readoptions_set_snapshot(roptions, snap);
    CheckGet(db, roptions, "foo", "hello");
    leveldb_readoptions_set_snapshot(roptions, NULL);
    CheckGet(db, roptions, "foo", NULL);
    leveldb_release_snapshot(db, snap);
  }

  StartPhase("repair");
  {
    leveldb_close(db);
    leveldb_options_set_create_if_missing(options, 0);
    leveldb_options_set_error_if_exists(options, 0);
    leveldb_repair_db(options, dbname, &err);
    CheckNoError(err);
    db = leveldb_open(options, dbname, &err);
    CheckNoError(err);
    CheckGet(db, roptions, "foo", NULL);
    CheckGet(db, roptions, "bar", NULL);
    CheckGet(db, roptions, "box", "c");
    leveldb_options_set_create_if_missing(options, 1);
    leveldb_options_set_error_if_exists(options, 1);
  }

  StartPhase("filter");
  for (run = 0; run < 2; run++) {
    // First run uses custom filter, second run uses bloom filter
    CheckNoError(err);
    leveldb_filterpolicy_t* policy;
    if (run == 0) {
      policy = leveldb_filterpolicy_create(
          NULL, FilterDestroy, FilterCreate, FilterKeyMatch, FilterName);
    } else {
      policy = leveldb_filterpolicy_create_bloom(10);
    }

    // Create new database
    leveldb_close(db);
    leveldb_destroy_db(options, dbname, &err);
    leveldb_options_set_filter_policy(options, policy);
    db = leveldb_open(options, dbname, &err);
    CheckNoError(err);
    leveldb_put(db, woptions, "foo", 3, "foovalue", 8, &err);
    CheckNoError(err);
    leveldb_put(db, woptions, "bar", 3, "barvalue", 8, &err);
    CheckNoError(err);
    leveldb_compact_range(db, NULL, 0, NULL, 0);

    fake_filter_result = 1;
    CheckGet(db, roptions, "foo", "foovalue");
    CheckGet(db, roptions, "bar", "barvalue");
    if (phase == 0) {
      // Must not find value when custom filter returns false
      fake_filter_result = 0;
      CheckGet(db, roptions, "foo", NULL);
      CheckGet(db, roptions, "bar", NULL);
      fake_filter_result = 1;

      CheckGet(db, roptions, "foo", "foovalue");
      CheckGet(db, roptions, "bar", "barvalue");
    }
    leveldb_options_set_filter_policy(options, NULL);
    leveldb_filterpolicy_destroy(policy);
  }

  StartPhase("cleanup");
  leveldb_close(db);
  leveldb_options_destroy(options);
  leveldb_readoptions_destroy(roptions);
  leveldb_writeoptions_destroy(woptions);
  leveldb_free(dbname);
  leveldb_cache_destroy(cache);
  leveldb_comparator_destroy(cmp);
  leveldb_env_destroy(env);

  fprintf(stderr, "PASS\n");
  return 0;
}